

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Request_get_status(MPIABI_Request request,int *flag,MPIABI_Status *status)

{
  MPIABI_Status *pMVar1;
  int iVar2;
  ompi_request_t *poVar3;
  MPI_Status *pMVar4;
  WPI_StatusPtr local_30;
  WPI_Handle local_28 [8];
  MPIABI_Status *local_20;
  MPIABI_Status *status_local;
  int *flag_local;
  MPIABI_Request request_local;
  
  local_20 = status;
  status_local = (MPIABI_Status *)flag;
  flag_local = (int *)request;
  WPI_Handle<ompi_request_t_*>::WPI_Handle((WPI_Handle<ompi_request_t_*> *)local_28,request);
  poVar3 = WPI_Handle::operator_cast_to_ompi_request_t_(local_28);
  pMVar1 = status_local;
  WPI_StatusPtr::WPI_StatusPtr(&local_30,local_20);
  pMVar4 = WPI_StatusPtr::operator_cast_to_ompi_status_public_t_(&local_30);
  iVar2 = MPI_Request_get_status(poVar3,pMVar1,pMVar4);
  WPI_StatusPtr::~WPI_StatusPtr(&local_30);
  return iVar2;
}

Assistant:

int MPIABI_Request_get_status(
  MPIABI_Request request,
  int * flag,
  MPIABI_Status * status
) {
  return MPI_Request_get_status(
    (MPI_Request)(WPI_Request)request,
    flag,
    (MPI_Status *)(WPI_StatusPtr)status
  );
}